

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_dialog(t_my_numbox *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *canvas;
  t_symbol *s_00;
  t_float tVar1;
  t_float tVar2;
  t_float tVar3;
  undefined1 local_198 [8];
  t_atom undo [18];
  int local_68;
  int sr_flags;
  int log_height;
  int lilo;
  double max;
  double min;
  int h;
  int w;
  t_symbol *srl [3];
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_my_numbox *x_local;
  
  tVar1 = atom_getfloatarg(0,argc,argv);
  min._4_4_ = (int)tVar1;
  tVar1 = atom_getfloatarg(1,argc,argv);
  min._0_4_ = (int)tVar1;
  tVar1 = atom_getfloatarg(2,argc,argv);
  tVar2 = atom_getfloatarg(3,argc,argv);
  tVar3 = atom_getfloatarg(4,argc,argv);
  sr_flags = (int)tVar3;
  tVar3 = atom_getfloatarg(6,argc,argv);
  local_68 = (int)tVar3;
  iemgui_setdialogatoms(&x->x_gui,0x12,(t_atom *)local_198);
  local_198._0_4_ = A_FLOAT;
  undo[0].a_type = (t_atomtype)(float)x->x_numwidth;
  undo[1].a_w.w_float = 1.4013e-45;
  undo[2].a_type = (t_atomtype)(float)x->x_min;
  undo[2].a_w.w_float = 1.4013e-45;
  undo[3].a_type = (t_atomtype)(float)x->x_max;
  undo[3].a_w.w_float = 1.4013e-45;
  undo[4].a_type = (t_atomtype)(float)x->x_lin0_log1;
  undo[5].a_w.w_float = 1.4013e-45;
  undo[6].a_type = (t_atomtype)(float)x->x_log_height;
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,(t_atom *)local_198,argc,argv);
  if (sr_flags != 0) {
    sr_flags = 1;
  }
  x->x_lin0_log1 = sr_flags;
  iemgui_dialog(&x->x_gui,(t_symbol **)&h,argc,argv);
  if (min._4_4_ < 1) {
    min._4_4_ = 1;
  }
  x->x_numwidth = min._4_4_;
  if (min._0_4_ < 8) {
    min._0_4_ = 8;
  }
  (x->x_gui).x_h = min._0_4_ * ((x->x_gui).x_glist)->gl_zoom;
  if (local_68 < 10) {
    local_68 = 10;
  }
  x->x_log_height = local_68;
  my_numbox_calc_fontwidth(x);
  my_numbox_check_minmax(x,(double)tVar1,(double)tVar2);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void my_numbox_dialog(t_my_numbox *x, t_symbol *s, int argc,
    t_atom *argv)
{
    t_symbol *srl[3];
    int w = (int)atom_getfloatarg(0, argc, argv);
    int h = (int)atom_getfloatarg(1, argc, argv);
    double min = (double)atom_getfloatarg(2, argc, argv);
    double max = (double)atom_getfloatarg(3, argc, argv);
    int lilo = (int)atom_getfloatarg(4, argc, argv);
    int log_height = (int)atom_getfloatarg(6, argc, argv);
    int sr_flags;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT(undo+0, x->x_numwidth);
    SETFLOAT(undo+2, x->x_min);
    SETFLOAT(undo+3, x->x_max);
    SETFLOAT(undo+4, x->x_lin0_log1);
    SETFLOAT(undo+6, x->x_log_height);

    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    if(lilo != 0) lilo = 1;
    x->x_lin0_log1 = lilo;
    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    if(w < MINDIGITS)
        w = MINDIGITS;
    x->x_numwidth = w;
    if(h < IEM_GUI_MINSIZE)
        h = IEM_GUI_MINSIZE;
    x->x_gui.x_h = h * IEMGUI_ZOOM(x);
    if(log_height < 10)
        log_height = 10;
    x->x_log_height = log_height;
    my_numbox_calc_fontwidth(x);
    /*if(my_numbox_check_minmax(x, min, max))
     my_numbox_bang(x);*/
    my_numbox_check_minmax(x, min, max);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
    iemgui_size(x, &x->x_gui);
}